

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
* __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::insert
          (pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
           *__return_storage_ptr__,
          Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key,int *payload)

{
  longlong *plVar1;
  TraversalNode *pTVar2;
  TraversalNode *pTVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  self_type *psVar12;
  AlexNode<int,_int> **ppAVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  ulong uVar16;
  allocator<std::pair<int,_int>_> *paVar17;
  TraversalNode TVar18;
  TraversalNode TVar19;
  undefined1 auVar20 [16];
  TraversalNode *pTVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  pair<int,_int> pVar25;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar26;
  long lVar27;
  long lVar28;
  model_node_type *pmVar29;
  model_node_type *node;
  pointer pFVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  pointer pFVar36;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *unaff_R13;
  int *piVar37;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar38;
  uint uVar39;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *ppVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  undefined8 in_XMM0_Qa;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 in_XMM8_Qb;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  traversal_path;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  used_fanout_tree_nodes;
  model_node_type *parent;
  undefined1 local_d8 [8];
  TraversalNode *pTStack_d0;
  pointer local_c8;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> local_b8;
  model_node_type *local_98;
  int *local_90;
  int local_84;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *local_80;
  double local_78;
  int *local_70;
  double local_68;
  undefined8 uStack_60;
  ulong local_50;
  Iterator local_48;
  
  iVar24 = *key;
  iVar33 = (this->istats_).key_domain_max_;
  local_70 = payload;
  if (iVar33 < iVar24) {
    iVar32 = (this->istats_).num_keys_above_key_domain;
    iVar31 = iVar32 + 1;
    (this->istats_).num_keys_above_key_domain = iVar31;
    if (3 < iVar32 && this->root_node_->is_leaf_ == false) {
      iVar22 = (this->stats_).num_keys / (this->istats_).num_keys_at_last_right_domain_resize;
LAB_00142b5a:
      if ((0x3e6 < iVar32) || (iVar22 * 2 + -2 <= iVar31)) {
        expand_root(this,*key,iVar24 <= iVar33);
      }
    }
  }
  else if (iVar24 < (this->istats_).key_domain_min_) {
    iVar32 = (this->istats_).num_keys_below_key_domain;
    iVar31 = iVar32 + 1;
    (this->istats_).num_keys_below_key_domain = iVar31;
    if (3 < iVar32 && this->root_node_->is_leaf_ == false) {
      iVar22 = (this->stats_).num_keys / (this->istats_).num_keys_at_last_left_domain_resize;
      goto LAB_00142b5a;
    }
  }
  pAVar26 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)this->root_node_;
  pAVar38 = pAVar26;
  if ((pAVar26->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar24 = *key;
    auVar43._0_8_ = (double)iVar24;
    auVar43._8_8_ = in_XMM0_Qa;
    lVar27 = (this->stats_).num_node_lookups;
    auVar42._8_8_ = 0x7fffffffffffffff;
    auVar42._0_8_ = 0x7fffffffffffffff;
    do {
      auVar53._8_8_ = 0;
      auVar53._0_8_ = (pAVar26->super_AlexNode<int,_int>).model_.a_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (pAVar26->super_AlexNode<int,_int>).model_.b_;
      auVar6 = vfmadd213sd_fma(auVar53,auVar43,auVar6);
      dVar52 = auVar6._0_8_;
      uVar39 = *(int *)&pAVar26->allocator_ - 1;
      uVar23 = ~((int)dVar52 >> 0x1f) & (int)dVar52;
      if ((int)uVar23 <= (int)uVar39) {
        uVar39 = uVar23;
      }
      pAVar26 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)(&(pAVar26->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar39];
      bVar11 = (pAVar26->super_AlexNode<int,_int>).is_leaf_;
      if (bVar11 == true) {
        lVar27 = lVar27 + (pAVar26->super_AlexNode<int,_int>).level_;
        (this->stats_).num_node_lookups = lVar27;
        auVar53 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar52 + 0.5)));
        auVar54._8_8_ = 0;
        auVar54._0_8_ = dVar52 - auVar53._0_8_;
        auVar6 = vandpd_avx(auVar54,auVar42);
        unaff_R13 = pAVar26;
        if (auVar6._0_8_ <= dVar52 * 2.220446049250313e-15) {
          if (auVar53._0_8_ <= dVar52) {
            pAVar38 = pAVar26->prev_leaf_;
            if (pAVar38 !=
                (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)0x0) {
              iVar33 = pAVar38->data_capacity_;
              uVar35 = (long)(iVar33 + -1);
              do {
                uVar34 = uVar35;
                if (iVar33 < 1) {
                  iVar33 = -0x80000000;
                  goto LAB_00142d21;
                }
                iVar33 = iVar33 + -1;
                uVar35 = uVar34 - 1;
              } while ((pAVar38->bitmap_[uVar34 >> 6 & 0x3ffffff] >> (uVar34 & 0x3f) & 1) == 0);
              iVar33 = pAVar38->key_slots_[uVar34];
LAB_00142d21:
              unaff_R13 = pAVar38;
              if (iVar33 < iVar24) {
                unaff_R13 = pAVar26;
              }
            }
          }
          else {
            psVar12 = pAVar26->next_leaf_;
            if (psVar12 != (self_type *)0x0) {
              iVar33 = 0x7fffffff;
              if (0 < psVar12->data_capacity_) {
                uVar35 = 0;
                do {
                  if ((psVar12->bitmap_[uVar35 >> 6 & 0x3ffffff] >> (uVar35 & 0x3f) & 1) != 0) {
                    iVar33 = psVar12->key_slots_[uVar35];
                    break;
                  }
                  uVar35 = uVar35 + 1;
                } while (psVar12->data_capacity_ != (int)uVar35);
              }
              unaff_R13 = psVar12;
              if (iVar24 < iVar33) {
                unaff_R13 = pAVar26;
              }
            }
          }
        }
      }
      pAVar38 = unaff_R13;
    } while (bVar11 == false);
  }
  local_90 = key;
  local_80 = __return_storage_ptr__;
  pVar25 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
           insert(pAVar38,key,local_70);
  uVar35 = (ulong)pVar25 >> 0x20;
  iVar24 = pVar25.first;
  ppVar40 = local_80;
  if (iVar24 == 0) goto LAB_001434ee;
  if (iVar24 == -1) {
    pTStack_d0 = (TraversalNode *)((ulong)pVar25 >> 0x20);
    local_c8 = (pointer)0x0;
    local_d8 = (undefined1  [8])pAVar38;
    Iterator::initialize((Iterator *)local_d8);
    (local_80->first).cur_leaf_ = (data_node_type *)local_d8;
    *(TraversalNode **)&(local_80->first).cur_idx_ = pTStack_d0;
    (local_80->first).cur_bitmap_data_ = (uint64_t)local_c8;
    local_80->second = false;
    return local_80;
  }
  local_d8 = (undefined1  [8])0x0;
  pTStack_d0 = (TraversalNode *)0x0;
  local_c8 = (TraversalNode *)0x0;
  local_84 = *local_90;
  local_b8.super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this->superroot_;
  local_b8.super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_50 = uVar35;
  std::
  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
  ::
  _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
              *)local_d8,(iterator)0x0,(TraversalNode *)&local_b8);
  pFVar36 = (pointer)this->root_node_;
  if (*(bool *)&pFVar36->cost == false) {
    local_68 = (double)local_84;
    do {
      auVar50._8_8_ = 0;
      auVar50._0_8_ = ((LinearModel<int> *)&pFVar36->left_boundary)->a_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_68;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(double *)&pFVar36->use;
      auVar43 = vfmadd213sd_fma(auVar50,auVar47,auVar10);
      local_78 = auVar43._0_8_;
      uVar39 = *(int *)&pFVar36->a - 1;
      uVar23 = ~((int)local_78 >> 0x1f) & (int)local_78;
      if ((int)uVar23 <= (int)uVar39) {
        uVar39 = uVar23;
      }
      local_b8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = pFVar36;
      local_b8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = uVar39;
      if (pTStack_d0 == local_c8) {
        std::
        vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
        ::
        _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                  ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                    *)local_d8,(iterator)pTStack_d0,(TraversalNode *)&local_b8);
      }
      else {
        pTStack_d0->node = (model_node_type *)pFVar36;
        *(ulong *)&pTStack_d0->bucketID =
             CONCAT44(local_b8.
                      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_,uVar39);
        pTStack_d0 = pTStack_d0 + 1;
      }
      pTVar21 = pTStack_d0;
      pFVar36 = (pointer)((AlexNode<int,_int> **)pFVar36->b)[(int)uVar39];
    } while (*(bool *)&pFVar36->cost != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)*(short *)((long)&pFVar36->cost + 2);
    auVar43 = vcvtdq2pd_avx(ZEXT416((uint)(int)(local_78 + 0.5)));
    auVar15._8_8_ = 0x7fffffffffffffff;
    auVar15._0_8_ = 0x7fffffffffffffff;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_78 - auVar43._0_8_;
    auVar42 = vandpd_avx512vl(auVar51,auVar15);
    if (auVar42._0_8_ <= local_78 * 2.220446049250313e-15) {
      if (auVar43._0_8_ <= local_78) {
        lVar27 = *(long *)&pFVar36->num_keys;
        if (lVar27 != 0) {
          iVar33 = *(int *)(lVar27 + 0x58);
          uVar35 = (long)(iVar33 + -1);
          do {
            if (iVar33 < 1) {
              iVar33 = -0x80000000;
              goto LAB_0014326a;
            }
            iVar33 = iVar33 + -1;
            uVar16 = uVar35 >> 6;
            uVar34 = uVar35 - 1;
            uVar14 = uVar35 & 0x3f;
            uVar35 = uVar34;
          } while ((*(ulong *)(*(long *)(lVar27 + 0x60) + (uVar16 & 0x3ffffff) * 8) >> uVar14 & 1)
                   == 0);
          iVar33 = *(int *)(*(long *)(lVar27 + 0x48) + 4 + uVar34 * 4);
LAB_0014326a:
          if (local_84 <= iVar33) {
            uVar39 = pTStack_d0[-1].bucketID;
            uVar23 = (int)uVar39 % (1 << (*(uint8_t *)((long)&pFVar36->cost + 1) & 0x1f));
            if (uVar39 != uVar23) {
              iVar33 = uVar39 + ~uVar23;
              goto LAB_00143439;
            }
            pTVar2 = pTStack_d0 + -1;
            pmVar29 = pTVar2->node;
            do {
              pTVar3 = pTStack_d0 + -1;
              bVar41 = (pmVar29->super_AlexNode<int,_int>).duplication_factor_;
              pTVar21[-1].bucketID = pTStack_d0[-2].bucketID;
              pTVar2->node = pTStack_d0[-2].node;
              uVar39 = pTVar21[-1].bucketID;
              uVar23 = (int)uVar39 % (1 << (bVar41 & 0x1f));
              pmVar29 = pTVar21[-1].node;
              pTStack_d0 = pTVar3;
            } while (uVar39 == uVar23);
            iVar33 = uVar39 + ~uVar23;
            pTVar21[-1].bucketID = iVar33;
            pFVar30 = (pointer)pmVar29->children_[iVar33];
            if (*(bool *)&pFVar30->cost == false) {
              do {
                local_b8.
                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_4_ = *(int *)&pFVar30->a - 1;
                local_b8.
                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                ._M_impl.super__Vector_impl_data._M_start = pFVar30;
                if (pTStack_d0 == local_c8) {
                  std::
                  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                  ::
                  _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                              *)local_d8,(iterator)pTStack_d0,(TraversalNode *)&local_b8);
                }
                else {
                  TVar18.bucketID =
                       (uint)local_b8.
                             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  TVar18.node = (model_node_type *)pFVar30;
                  TVar18._12_4_ =
                       local_b8.
                       super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
                  *pTStack_d0 = TVar18;
                  pTStack_d0 = pTStack_d0 + 1;
                }
                pFVar30 = (pointer)((AlexNode<int,_int> **)pFVar30->b)
                                   [(long)*(int *)&pFVar30->a + -1];
              } while (*(bool *)&pFVar30->cost != true);
            }
            if (pFVar30 != *(pointer *)&pFVar36->num_keys) {
              __assert_fail("cur == leaf->prev_leaf_",
                            "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                            ,0x1fc,
                            "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                           );
            }
          }
        }
      }
      else {
        ppAVar13 = (AlexNode<int,_int> **)pFVar36->b;
        if (ppAVar13 != (AlexNode<int,_int> **)0x0) {
          iVar33 = 0x7fffffff;
          if (0 < *(int *)(ppAVar13 + 0xb)) {
            uVar35 = 0;
            do {
              if (((ulong)(&ppAVar13[0xc]->_vptr_AlexNode)[uVar35 >> 6 & 0x3ffffff] >>
                   (uVar35 & 0x3f) & 1) != 0) {
                iVar33 = *(int *)((long)&ppAVar13[9]->_vptr_AlexNode + uVar35 * 4);
                break;
              }
              uVar35 = uVar35 + 1;
            } while (*(int *)(ppAVar13 + 0xb) != (int)uVar35);
          }
          if (iVar33 <= local_84) {
            iVar33 = 1 << (*(uint8_t *)((long)&pFVar36->cost + 1) & 0x1f);
            pmVar29 = pTStack_d0[-1].node;
            iVar33 = (pTStack_d0[-1].bucketID - pTStack_d0[-1].bucketID % iVar33) + iVar33;
            if (iVar33 == pmVar29->num_children_) {
              pTVar2 = pTStack_d0 + -1;
              do {
                pTVar3 = pTStack_d0 + -1;
                iVar33 = 1 << ((pmVar29->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
                pTVar21[-1].bucketID = pTStack_d0[-2].bucketID;
                pTVar2->node = pTStack_d0[-2].node;
                pmVar29 = pTVar21[-1].node;
                iVar33 = (pTVar21[-1].bucketID + iVar33) - pTVar21[-1].bucketID % iVar33;
                pTStack_d0 = pTVar3;
              } while (iVar33 == pmVar29->num_children_);
              pTVar21[-1].bucketID = iVar33;
              pFVar30 = (pointer)pmVar29->children_[iVar33];
              if (*(bool *)&pFVar30->cost == false) {
                do {
                  local_b8.
                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  local_b8.
                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start = pFVar30;
                  if (pTStack_d0 == local_c8) {
                    std::
                    vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                    ::
                    _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                              ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                                *)local_d8,(iterator)pTStack_d0,(TraversalNode *)&local_b8);
                  }
                  else {
                    TVar19.bucketID = 0;
                    TVar19.node = (model_node_type *)pFVar30;
                    TVar19._12_4_ =
                         local_b8.
                         super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
                    *pTStack_d0 = TVar19;
                    pTStack_d0 = pTStack_d0 + 1;
                  }
                  pFVar30 = *(pointer *)pFVar30->b;
                } while (*(bool *)&pFVar30->cost != true);
              }
              if (pFVar30 != (pointer)pFVar36->b) {
                __assert_fail("cur == leaf->next_leaf_",
                              "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                              ,0x217,
                              "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                             );
              }
            }
            else {
LAB_00143439:
              pTStack_d0[-1].bucketID = iVar33;
            }
          }
        }
      }
    }
  }
  local_98 = pTStack_d0[-1].node;
  bVar41 = iVar24 == 0;
  uVar35 = local_50;
  ppVar40 = local_80;
  if (!(bool)bVar41) {
    local_68 = 0.9;
    uStack_60 = 0x3feccccccccccccd;
    do {
      local_78 = (double)CONCAT71(local_78._1_7_,bVar41);
      lVar27 = std::chrono::_V2::system_clock::now();
      piVar37 = &(this->stats_).num_expand_and_scales;
      *piVar37 = *piVar37 + pAVar38->num_resizes_;
      if (local_98 == this->superroot_) {
        update_superroot_key_domain(this);
      }
      auVar44._8_8_ = 0;
      auVar44._0_8_ = (local_98->super_AlexNode<int,_int>).model_.a_;
      auVar48._0_8_ = (double)*local_90;
      auVar48._8_8_ = in_XMM8_Qb;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (local_98->super_AlexNode<int,_int>).model_.b_;
      auVar43 = vfmadd213sd_fma(auVar48,auVar44,auVar7);
      uVar39 = local_98->num_children_ - 1;
      uVar23 = ~((int)auVar43._0_8_ >> 0x1f) & (int)auVar43._0_8_;
      if ((int)uVar23 <= (int)uVar39) {
        uVar39 = uVar23;
      }
      local_b8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_b8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      local_b8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar24 = (this->experimental_params_).splitting_policy_method;
      iVar33 = pVar25.first;
      uVar23 = 1;
      if (iVar33 < 2 && iVar24 != 0) {
        if (iVar24 == 1) {
          iVar24 = 2;
        }
        else {
          if (iVar24 != 2) goto LAB_00142e9c;
          iVar24 = (this->derived_params_).max_fanout;
        }
        uVar23 = fanout_tree::find_best_fanout_existing_node<int,int>
                           (local_98,uVar39,(this->stats_).num_keys,&local_b8,iVar24);
      }
LAB_00142e9c:
      lVar28 = std::chrono::_V2::system_clock::now();
      piVar37 = local_90;
      (this->stats_).cost_computation_time =
           (double)(lVar28 - lVar27) + (this->stats_).cost_computation_time;
      if (uVar23 == 0) {
        auVar45._0_8_ = (double)pAVar38->num_inserts_;
        uVar4 = pAVar38->num_right_out_of_bounds_inserts_;
        uVar5 = pAVar38->num_left_out_of_bounds_inserts_;
        auVar8._4_4_ = uVar5;
        auVar8._0_4_ = uVar4;
        auVar8._8_8_ = 0;
        auVar43 = vcvtdq2pd_avx(auVar8);
        auVar45._8_8_ = auVar45._0_8_;
        auVar43 = vdivpd_avx(auVar43,auVar45);
        auVar20._8_8_ = uStack_60;
        auVar20._0_8_ = local_68;
        uVar35 = vcmppd_avx512vl(auVar43,auVar20,0xe);
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
        resize(pAVar38,0.6,true,(bool)((byte)(uVar35 & 3) & 1),SUB81((uVar35 & 3) >> 1,0));
        (pAVar38->super_AlexNode<int,_int>).cost_ =
             (local_b8.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_start)->cost;
        paVar17 = (allocator<std::pair<int,_int>_> *)
                  (local_b8.
                   super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start)->expected_avg_shifts;
        pAVar38->expected_avg_exp_search_iterations_ =
             (local_b8.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_start)->expected_avg_search_iterations;
        pAVar38->expected_avg_shifts_ = (double)paVar17;
        pAVar38->num_shifts_ = 0;
        pAVar38->num_exp_search_iterations_ = 0;
        *(undefined8 *)((long)&pAVar38->num_exp_search_iterations_ + 4) = 0;
        pAVar38->num_inserts_ = 0;
        pAVar38->num_resizes_ = 0;
        piVar37 = &(this->stats_).num_expand_and_retrains;
        *piVar37 = *piVar37 + 1;
        piVar37 = local_90;
      }
      else {
        if ((this->experimental_params_).allow_splitting_upwards == true) {
          if ((this->experimental_params_).splitting_policy_method == 2) {
            __assert_fail("experimental_params_.splitting_policy_method != 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                          ,0x4bc,
                          "std::pair<Iterator, bool> alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::insert(const T &, const P &) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                         );
          }
          iVar24 = best_split_propagation
                             (this,(vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                                    *)local_d8,false);
          if ((this->superroot_->super_AlexNode<int,_int>).level_ < iVar24) {
            split_upwards(this,*piVar37,iVar24,
                          (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                           *)local_d8,iVar33 == 3,&local_98,false);
          }
          else {
            local_98 = split_downwards(this,local_98,uVar39,uVar23,&local_b8,iVar33 == 3);
          }
        }
        else if (((this->derived_params_).max_fanout <
                  (local_98->num_children_ << (uVar23 & 0x1f)) /
                  (1 << ((pAVar38->super_AlexNode<int,_int>).duplication_factor_ & 0x1f))) ||
                ((local_98->super_AlexNode<int,_int>).level_ ==
                 (this->superroot_->super_AlexNode<int,_int>).level_)) {
          local_98 = split_downwards(this,local_98,uVar39,uVar23,&local_b8,iVar33 == 3);
          piVar37 = local_90;
        }
        else {
          split_sideways(this,local_98,uVar39,uVar23,&local_b8,iVar33 == 3);
          piVar37 = local_90;
        }
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (local_98->super_AlexNode<int,_int>).model_.a_;
        auVar49._0_8_ = (double)*piVar37;
        auVar49._8_8_ = in_XMM8_Qb;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (local_98->super_AlexNode<int,_int>).model_.b_;
        auVar43 = vfmadd213sd_fma(auVar49,auVar46,auVar9);
        uVar39 = local_98->num_children_ - 1;
        uVar23 = ~((int)auVar43._0_8_ >> 0x1f) & (int)auVar43._0_8_;
        if ((int)uVar23 <= (int)uVar39) {
          uVar39 = uVar23;
        }
        pAVar38 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                   *)local_98->children_[(int)uVar39];
      }
      lVar28 = std::chrono::_V2::system_clock::now();
      (this->stats_).splitting_time = (double)(lVar28 - lVar27) + (this->stats_).splitting_time;
      pVar25 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::insert(pAVar38,piVar37,local_70);
      if (pVar25.first == -1) {
        local_48.cur_idx_ = pVar25.second;
        local_48.cur_bitmap_idx_ = 0;
        local_48.cur_bitmap_data_ = 0;
        local_48.cur_leaf_ = pAVar38;
        Iterator::initialize(&local_48);
        ppVar40 = local_80;
        (local_80->first).cur_leaf_ = local_48.cur_leaf_;
        (local_80->first).cur_idx_ = local_48.cur_idx_;
        (local_80->first).cur_bitmap_idx_ = local_48.cur_bitmap_idx_;
        (local_80->first).cur_bitmap_data_ = local_48.cur_bitmap_data_;
        local_80->second = false;
        if (local_b8.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar35 = (ulong)pVar25 >> 0x20;
        bVar41 = local_78._0_1_;
        goto LAB_001434cf;
      }
      if (local_b8.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar41 = pVar25.first == 0;
    } while (!(bool)bVar41);
    uVar35 = (ulong)pVar25 >> 0x20;
    ppVar40 = local_80;
  }
LAB_001434cf:
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  if ((bVar41 & 1) == 0) {
    return ppVar40;
  }
LAB_001434ee:
  plVar1 = &(this->stats_).num_inserts;
  *plVar1 = *plVar1 + 1;
  (this->stats_).num_keys = (this->stats_).num_keys + 1;
  pTStack_d0 = (TraversalNode *)(uVar35 & 0xffffffff);
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [8])pAVar38;
  Iterator::initialize((Iterator *)local_d8);
  (ppVar40->first).cur_leaf_ = (data_node_type *)local_d8;
  *(TraversalNode **)&(ppVar40->first).cur_idx_ = pTStack_d0;
  (ppVar40->first).cur_bitmap_data_ = (uint64_t)local_c8;
  ppVar40->second = true;
  return ppVar40;
}

Assistant:

std::pair<Iterator, bool> insert(const T& key, const P& payload) {
    // If enough keys fall outside the key domain, expand the root to expand the
    // key domain
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain++;
      if (should_expand_right()) {
        expand_root(key, false);  // expand to the right
      }
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain++;
      if (should_expand_left()) {
        expand_root(key, true);  // expand to the left
      }
    }

    data_node_type* leaf = get_leaf(key);

    // Nonzero fail flag means that the insert did not happen
    std::pair<int, int> ret = leaf->insert(key, payload);
    int fail = ret.first;
    int insert_pos = ret.second;
    if (fail == -1) {
      // Duplicate found and duplicates not allowed
      return {Iterator(leaf, insert_pos), false};
    }

    // If no insert, figure out what to do with the data node to decrease the
    // cost
    if (fail) {
      std::vector<TraversalNode> traversal_path;
      get_leaf(key, &traversal_path);
      model_node_type* parent = traversal_path.back().node;

      while (fail) {
        auto start_time = std::chrono::high_resolution_clock::now();
        stats_.num_expand_and_scales += leaf->num_resizes_;

        if (parent == superroot_) {
          update_superroot_key_domain();
        }
        int bucketID = parent->model_.predict(key);
        bucketID = std::min<int>(std::max<int>(bucketID, 0),
                                 parent->num_children_ - 1);
        std::vector<fanout_tree::FTNode> used_fanout_tree_nodes;

        int fanout_tree_depth = 1;
        if (experimental_params_.splitting_policy_method == 0 || fail >= 2) {
          // always split in 2. No extra work required here
        } else if (experimental_params_.splitting_policy_method == 1) {
          // decide between no split (i.e., expand and retrain) or splitting in
          // 2
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes, 2);
        } else if (experimental_params_.splitting_policy_method == 2) {
          // use full fanout tree to decide fanout
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes,
              derived_params_.max_fanout);
        }
        int best_fanout = 1 << fanout_tree_depth;
        stats_.cost_computation_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(
                std::chrono::high_resolution_clock::now() - start_time)
                .count();

        if (fanout_tree_depth == 0) {
          // expand existing data node and retrain model
          leaf->resize(data_node_type::kMinDensity_, true,
                       leaf->is_append_mostly_right(),
                       leaf->is_append_mostly_left());
          fanout_tree::FTNode& tree_node = used_fanout_tree_nodes[0];
          leaf->cost_ = tree_node.cost;
          leaf->expected_avg_exp_search_iterations_ =
              tree_node.expected_avg_search_iterations;
          leaf->expected_avg_shifts_ = tree_node.expected_avg_shifts;
          leaf->reset_stats();
          stats_.num_expand_and_retrains++;
        } else {
          // split data node: always try to split sideways/upwards, only split
          // downwards if necessary
          bool reuse_model = (fail == 3);
          if (experimental_params_.allow_splitting_upwards) {
            // allow splitting upwards
            assert(experimental_params_.splitting_policy_method != 2);
            int stop_propagation_level = best_split_propagation(traversal_path);
            if (stop_propagation_level <= superroot_->level_) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_upwards(key, stop_propagation_level, traversal_path,
                            reuse_model, &parent);
            }
          } else {
            // either split sideways or downwards
            bool should_split_downwards =
                (parent->num_children_ * best_fanout /
                         (1 << leaf->duplication_factor_) >
                     derived_params_.max_fanout ||
                 parent->level_ == superroot_->level_);
            if (should_split_downwards) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_sideways(parent, bucketID, fanout_tree_depth,
                             used_fanout_tree_nodes, reuse_model);
            }
          }
          leaf = static_cast<data_node_type*>(parent->get_child_node(key));
        }
        auto end_time = std::chrono::high_resolution_clock::now();
        auto duration = end_time - start_time;
        stats_.splitting_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(duration)
                .count();

        // Try again to insert the key
        ret = leaf->insert(key, payload);
        fail = ret.first;
        insert_pos = ret.second;
        if (fail == -1) {
          // Duplicate found and duplicates not allowed
          return {Iterator(leaf, insert_pos), false};
        }
      }
    }
    stats_.num_inserts++;
    stats_.num_keys++;
    return {Iterator(leaf, insert_pos), true};
  }